

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O3

void __thiscall chrono::ChLinkRSDA::AdjustAngle(ChLinkRSDA *this)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  
  dVar1 = this->m_last_angle;
  if ((1.5707963267948966 < dVar1) && (this->m_angle < 0.0)) {
    this->m_angle = this->m_angle + 6.283185307179586;
  }
  dVar4 = this->m_angle;
  if ((dVar1 < -1.5707963267948966) && (0.0 < dVar4)) {
    dVar4 = dVar4 + -1.5707963267948966;
    this->m_angle = dVar4;
  }
  if (3.141592653589793 < dVar1 - dVar4) {
    this->m_turns = this->m_turns + 1;
  }
  if (dVar1 - dVar4 < -3.141592653589793) {
    this->m_turns = this->m_turns + -1;
  }
  if ((dVar4 < 0.0) && (0 < this->m_turns)) {
    uVar2 = this->m_turns + 1;
    do {
      dVar4 = dVar4 + 6.283185307179586;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    this->m_angle = dVar4;
    this->m_turns = 0;
  }
  if ((0.0 < dVar4) && (iVar3 = this->m_turns, iVar3 < 0)) {
    do {
      dVar4 = dVar4 + -6.283185307179586;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0);
    this->m_angle = dVar4;
    this->m_turns = 0;
  }
  this->m_last_angle = dVar4;
  return;
}

Assistant:

void ChLinkRSDA::AdjustAngle() {
    // Check cross at +- pi
    if (m_last_angle > CH_C_PI_2 && m_angle < 0)
        m_angle += CH_C_2PI;
    if (m_last_angle < -CH_C_PI_2 && m_angle > 0)
        m_angle -= CH_C_PI_2;

    // Accumulate full turns
    if (m_last_angle - m_angle > CH_C_PI)
        m_turns++;
    if (m_last_angle - m_angle < -CH_C_PI)
        m_turns--;

    if (m_angle < 0) {
        while (m_turns > 0) {
            m_angle += CH_C_2PI;
            m_turns--;
        }
    }
    if (m_angle > 0) {
        while (m_turns < 0) {
            m_angle -= CH_C_2PI;
            m_turns++;
        }
    }

    // Update last angle
    m_last_angle = m_angle;
}